

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutEdgeFlow(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  uint uVar2;
  If_Obj_t *pIVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = *(uint *)&pCut->field_0x1c;
  fVar5 = (float)(uVar2 >> 0x18);
  uVar4 = 0;
  while( true ) {
    if (uVar2 >> 0x18 <= uVar4) {
      return fVar5;
    }
    pIVar3 = If_ManObj(p,(int)(&pCut[1].Area)[uVar4]);
    if (pIVar3 == (If_Obj_t *)0x0) break;
    if ((pIVar3->nRefs == 0) ||
       (((undefined1  [112])*pIVar3 & (undefined1  [112])0xf) == (undefined1  [112])0x1)) {
      fVar6 = (pIVar3->CutBest).Edge;
    }
    else {
      fVar6 = pIVar3->EstRefs;
      if (fVar6 < p->fEpsilon || fVar6 == p->fEpsilon) {
        __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                      ,0x3c9,"float If_CutEdgeFlow(If_Man_t *, If_Cut_t *)");
      }
      fVar6 = (pIVar3->CutBest).Edge / fVar6;
    }
    fVar1 = 1e+32;
    if (((fVar5 < 1e+32) && (fVar1 = 1e+32, fVar6 < 1e+32)) &&
       (fVar1 = fVar5 + fVar6, 1e+32 < fVar5 + fVar6)) {
      fVar1 = 1e+32;
    }
    fVar5 = fVar1;
    uVar4 = uVar4 + 1;
    uVar2 = *(uint *)&pCut->field_0x1c;
  }
  return fVar5;
}

Assistant:

float If_CutEdgeFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow, AddOn;
    int i;
    Flow = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            AddOn = If_ObjCutBest(pLeaf)->Edge;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            AddOn = If_ObjCutBest(pLeaf)->Edge / pLeaf->EstRefs;
        }
        if ( Flow >= (float)1e32 || AddOn >= (float)1e32 )
            Flow = (float)1e32;
        else 
        {
            Flow += AddOn;
            if ( Flow > (float)1e32 )
                 Flow = (float)1e32;
        }
    }
    return Flow;
}